

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.h
# Opt level: O2

bool __thiscall
MemFile::read<std::vector<char,std::allocator<char>>>
          (MemFile *this,vector<char,_std::allocator<char>_> *buf)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
          (int)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
  iVar1 = remaining(this);
  if (iVar2 <= iVar1) {
    memcpy((buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start,(this->m_it)._M_current,(long)iVar2);
    (this->m_it)._M_current = (this->m_it)._M_current + iVar2;
  }
  return iVar2 <= iVar1;
}

Assistant:

bool read(T& buf)
    {
        auto total_size = static_cast<int>(sizeof(buf[0]) * buf.size());

        // Fail if we can't fill the target
        if (remaining() < total_size)
            return false;

        std::memcpy(buf.data(), &*m_it, total_size);
        //  std::copy(m_it, m_it + size, buf.data());
        m_it += total_size;
        return true;
    }